

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Gia_Man_t * Lf_ManPerformMappingInt(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Mem_t *pVVar4;
  char *pcVar5;
  word *pwVar6;
  bool bVar7;
  int iVar8;
  Gia_Man_t *pGia_00;
  Lf_Man_t *p;
  FILE *__stream;
  Gia_Man_t *p_00;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char pFileName [1000];
  char local_418 [1000];
  
  if (pPars->fUseMux7 != 0) {
    pPars->fCoarsen = 1;
    pPars->nRoundsEla = 0;
  }
  if ((pGia->pSibls != (int *)0x0) || (pPars->nLutSizeMux != 0)) {
    pPars->fCutMin = 1;
  }
  pGia_00 = pGia;
  if (pPars->fCoarsen != 0) {
    pGia_00 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    pGia_00->pManTime = pGia->pManTime;
    pGia->pManTime = (void *)0x0;
  }
  p = Lf_ManAlloc(pGia_00,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGia_00);
    putchar(10);
  }
  Lf_ManPrintInit(p);
  p->Iter = 0;
  if (0 < p->pPars->nRounds) {
    do {
      Lf_ManComputeMapping(p);
      iVar8 = p->Iter + 1;
      p->Iter = iVar8;
    } while (iVar8 < p->pPars->nRounds);
  }
  p->fUseEla = 1;
  if (p->Iter < pPars->nRoundsEla + p->pPars->nRounds) {
    do {
      Lf_ManComputeMapping(p);
      iVar8 = p->Iter + 1;
      p->Iter = iVar8;
    } while (iVar8 < pPars->nRoundsEla + p->pPars->nRounds);
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    pVVar4 = p->vTtMem;
    pcVar5 = p->pGia->pName;
    uVar1 = pPars->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar5);
    __stream = _stdout;
    if (pcVar5 != (char *)0x0) {
      __stream = fopen(local_418,"wb");
    }
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar4->nEntries);
    }
    if (0 < pVVar4->nEntries) {
      uVar11 = 0;
      do {
        pwVar6 = pVVar4->ppPages[uVar11 >> ((byte)pVVar4->LogPageSze & 0x1f)];
        if (pwVar6 == (word *)0x0) break;
        uVar2 = pVVar4->nEntrySize;
        if (0 < (int)uVar2) {
          uVar3 = pVVar4->PageMask;
          uVar13 = (ulong)uVar2;
          do {
            lVar12 = 0x3c;
            do {
              uVar10 = (uint)(pwVar6[(long)(int)((uVar3 & uVar11) * uVar2) + (uVar13 - 1)] >>
                             ((byte)lVar12 & 0x3f)) & 0xf;
              if (uVar10 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar10 + 0x37,__stream);
              }
              lVar12 = lVar12 + -4;
            } while (lVar12 != -4);
            bVar7 = 1 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar7);
        }
        fputc(10,__stream);
        uVar11 = uVar11 + 1;
      } while ((int)uVar11 < pVVar4->nEntries);
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    pcVar9 = local_418;
    if (pcVar5 == (char *)0x0) {
      pcVar9 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar4->nEntrySize * (double)pVVar4->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)pVVar4->nEntries,(ulong)uVar1,pcVar9);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      p_00 = Lf_ManDeriveMapping(p);
    }
    else {
      p_00 = Lf_ManDeriveMappingCoarse(p);
    }
  }
  else {
    p_00 = Lf_ManDeriveMappingGia(p);
  }
  Gia_ManMappingVerify(p_00);
  Lf_ManPrintQuit(p,p_00);
  Lf_ManFree(p);
  if (pGia_00 != pGia) {
    pGia->pManTime = pGia_00->pManTime;
    pGia_00->pManTime = (void *)0x0;
    Gia_ManStop(pGia_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Lf_ManPerformMappingInt( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    int fUsePowerMode = 0;
    Lf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fUseMux7 )
        pPars->fCoarsen = 1, pPars->nRoundsEla = 0;
    if ( Gia_ManHasChoices(pGia) || pPars->nLutSizeMux )
        pPars->fCutMin = 1; 
    if ( pPars->fCoarsen )
    {
        pCls = Gia_ManDupMuxes(pGia, pPars->nCoarseLimit);
        pCls->pManTime = pGia->pManTime; pGia->pManTime = NULL;
    }
    else pCls = pGia;
    p = Lf_ManAlloc( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Lf_ManPrintInit( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
        pPars->fPower = 0;

    // perform mapping
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        Lf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Lf_ManComputeMapping( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
    {
        pPars->fPower = 1;
        for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla + 2; p->Iter++ )
            Lf_ManComputeMapping( p );
    }

    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Lf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Lf_ManDeriveMappingCoarse( p );
    else
        pNew = Lf_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    Lf_ManPrintQuit( p, pNew );
    Lf_ManFree( p );
    if ( pCls != pGia )
    {
        pGia->pManTime = pCls->pManTime; pCls->pManTime = NULL;
        Gia_ManStop( pCls );
    }
    return pNew;
}